

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.h
# Opt level: O2

StringToDoubleMap * __thiscall
CoreML::Specification::Imputer::mutable_imputedstringdictionary(Imputer *this)

{
  StringToDoubleMap *this_00;
  
  if (this->_oneof_case_[0] == 6) {
    this_00 = (StringToDoubleMap *)(this->ImputedValue_).imputeddoublevalue_;
  }
  else {
    clear_ImputedValue(this);
    this->_oneof_case_[0] = 6;
    this_00 = (StringToDoubleMap *)operator_new(0x38);
    StringToDoubleMap::StringToDoubleMap(this_00);
    (this->ImputedValue_).imputedstringdictionary_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::StringToDoubleMap* Imputer::mutable_imputedstringdictionary() {
  if (!has_imputedstringdictionary()) {
    clear_ImputedValue();
    set_has_imputedstringdictionary();
    ImputedValue_.imputedstringdictionary_ = new ::CoreML::Specification::StringToDoubleMap;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Imputer.imputedStringDictionary)
  return ImputedValue_.imputedstringdictionary_;
}